

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double finv(double p,int num,int den)

{
  double dVar1;
  double b;
  double a;
  double k2;
  double k1;
  double x;
  int den_local;
  int num_local;
  double p_local;
  
  if ((p < 0.0) || (1.0 < p)) {
    printf("Probablity Values can only take values between 0.0 and 1.0");
    exit(1);
  }
  if ((0 < num) && (0 < den)) {
    dVar1 = betainv(p,(double)num / 2.0,(double)den / 2.0);
    k1 = ((double)den * dVar1) / ((double)num * (1.0 - dVar1));
    if ((p == 1.0) && (!NAN(p))) {
      k1 = 1.79e+308;
    }
    return k1;
  }
  printf("Degrees Of Freedom should be positive real integers");
  exit(1);
}

Assistant:

double finv(double p, int num,int den) {
	double x,k1,k2,a,b;
	
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	}
	
	if (num <= 0 || den <= 0) {
		printf("Degrees Of Freedom should be positive real integers");
		exit(1);
	}
	
	k1 = (double) num;
	k2 = (double) den;
	
	a = betainv(p,k1/2.,k2/2.);
	b = 1. - a;
	
	x = (k2 * a) / ( k1 * b);
	
	if ( p == 1.) {
		x = XINFVAL;
	}
	
	return x;
}